

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O2

bool __thiscall cmCTestTestHandler::GetListOfTests(cmCTestTestHandler *this)

{
  cmCTest *pcVar1;
  unique_ptr<cmState,_std::default_delete<cmState>_> uVar2;
  bool bVar3;
  ostream *poVar4;
  string *psVar5;
  cmValue cVar6;
  bool bVar7;
  char *__s;
  string_view value;
  char *local_1f78 [4];
  _Any_data local_1f58;
  code *local_1f48;
  code *pcStack_1f40;
  _Any_data local_1f38;
  code *local_1f28;
  code *pcStack_1f20;
  _Any_data local_1f18;
  code *local_1f08;
  code *pcStack_1f00;
  ostringstream cmCTestLog_msg_1;
  cmake cm;
  cmMakefile mf;
  cmGlobalGenerator gg;
  
  if ((this->IncludeRegExp)._M_string_length != 0) {
    cmsys::RegularExpression::compile(&this->IncludeTestsRegularExpression,&this->IncludeRegExp);
  }
  if ((this->ExcludeRegExp)._M_string_length != 0) {
    cmsys::RegularExpression::compile(&this->ExcludeTestsRegularExpression,&this->ExcludeRegExp);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&mf);
  poVar4 = std::operator<<((ostream *)&mf,"Constructing a list of tests");
  std::endl<char,std::char_traits<char>>(poVar4);
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar1,5,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
               ,0x712,(char *)cm.Generators.
                              super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start,
               (this->super_cmCTestGenericHandler).Quiet);
  std::__cxx11::string::~string((string *)&cm);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&mf);
  cmake::cmake(&cm,RoleScript,CTest,Normal);
  std::__cxx11::string::string<std::allocator<char>>((string *)&mf,"",(allocator<char> *)&gg);
  cmake::SetHomeDirectory(&cm,(string *)&mf);
  std::__cxx11::string::~string((string *)&mf);
  std::__cxx11::string::string<std::allocator<char>>((string *)&mf,"",(allocator<char> *)&gg);
  cmake::SetHomeOutputDirectory(&cm,(string *)&mf);
  std::__cxx11::string::~string((string *)&mf);
  mf.FindPackageRootPathStack.
  super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur =
       (_Elt_pointer)cm.CurrentSnapshot.Position.Position;
  mf.FindPackageRootPathStack.
  super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)cm.CurrentSnapshot.State;
  mf.FindPackageRootPathStack.
  super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map_size = (size_t)cm.CurrentSnapshot.Position.Tree;
  cmStateSnapshot::SetDefaultDefinitions((cmStateSnapshot *)&mf);
  cmGlobalGenerator::cmGlobalGenerator(&gg,&cm);
  _cmCTestLog_msg_1 = cm.CurrentSnapshot.State;
  cmMakefile::cmMakefile(&mf,&gg,(cmStateSnapshot *)&cmCTestLog_msg_1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cmCTestLog_msg_1,"CTEST_CONFIGURATION_TYPE",(allocator<char> *)local_1f78);
  psVar5 = cmCTest::GetConfigType_abi_cxx11_((this->super_cmCTestGenericHandler).CTest);
  value._M_str = (psVar5->_M_dataplus)._M_p;
  value._M_len = psVar5->_M_string_length;
  cmMakefile::AddDefinition(&mf,(string *)&cmCTestLog_msg_1,value);
  std::__cxx11::string::~string((string *)&cmCTestLog_msg_1);
  uVar2 = cm.State;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cmCTestLog_msg_1,"add_test",(allocator<char> *)local_1f78);
  local_1f08 = (code *)0x0;
  pcStack_1f00 = (code *)0x0;
  local_1f18._M_unused._M_object = (void *)0x0;
  local_1f18._8_8_ = 0;
  local_1f18._M_unused._M_object = operator_new(0x10);
  *(cmCTestTestHandler **)((long)local_1f18._M_unused._0_8_ + 8) = this;
  *(undefined ***)local_1f18._M_unused._0_8_ = &PTR__cmCTestCommand_00a0dae0;
  pcStack_1f00 = std::
                 _Function_handler<bool_(const_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_&,_cmExecutionStatus_&),_(anonymous_namespace)::cmCTestAddTestCommand>
                 ::_M_invoke;
  local_1f08 = std::
               _Function_handler<bool_(const_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_&,_cmExecutionStatus_&),_(anonymous_namespace)::cmCTestAddTestCommand>
               ::_M_manager;
  cmState::AddBuiltinCommand
            ((cmState *)
             uVar2._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
             super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
             super__Head_base<0UL,_cmState_*,_false>._M_head_impl,(string *)&cmCTestLog_msg_1,
             (Command *)&local_1f18);
  std::_Function_base::~_Function_base((_Function_base *)&local_1f18);
  std::__cxx11::string::~string((string *)&cmCTestLog_msg_1);
  uVar2 = cm.State;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cmCTestLog_msg_1,"subdirs",(allocator<char> *)local_1f78);
  cmState::AddBuiltinCommand
            ((cmState *)
             uVar2._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
             super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
             super__Head_base<0UL,_cmState_*,_false>._M_head_impl,(string *)&cmCTestLog_msg_1,
             anon_unknown.dwarf_265520::cmCTestSubdirCommand);
  std::__cxx11::string::~string((string *)&cmCTestLog_msg_1);
  uVar2 = cm.State;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cmCTestLog_msg_1,"add_subdirectory",(allocator<char> *)local_1f78);
  cmState::AddBuiltinCommand
            ((cmState *)
             uVar2._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
             super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
             super__Head_base<0UL,_cmState_*,_false>._M_head_impl,(string *)&cmCTestLog_msg_1,
             anon_unknown.dwarf_265520::cmCTestAddSubdirectoryCommand);
  std::__cxx11::string::~string((string *)&cmCTestLog_msg_1);
  uVar2 = cm.State;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cmCTestLog_msg_1,"set_tests_properties",(allocator<char> *)local_1f78);
  local_1f28 = (code *)0x0;
  pcStack_1f20 = (code *)0x0;
  local_1f38._M_unused._M_object = (void *)0x0;
  local_1f38._8_8_ = 0;
  local_1f38._M_unused._M_object = operator_new(0x10);
  *(cmCTestTestHandler **)((long)local_1f38._M_unused._0_8_ + 8) = this;
  *(undefined ***)local_1f38._M_unused._0_8_ = &PTR__cmCTestCommand_00a0db30;
  pcStack_1f20 = std::
                 _Function_handler<bool_(const_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_&,_cmExecutionStatus_&),_(anonymous_namespace)::cmCTestSetTestsPropertiesCommand>
                 ::_M_invoke;
  local_1f28 = std::
               _Function_handler<bool_(const_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_&,_cmExecutionStatus_&),_(anonymous_namespace)::cmCTestSetTestsPropertiesCommand>
               ::_M_manager;
  cmState::AddBuiltinCommand
            ((cmState *)
             uVar2._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
             super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
             super__Head_base<0UL,_cmState_*,_false>._M_head_impl,(string *)&cmCTestLog_msg_1,
             (Command *)&local_1f38);
  std::_Function_base::~_Function_base((_Function_base *)&local_1f38);
  std::__cxx11::string::~string((string *)&cmCTestLog_msg_1);
  uVar2 = cm.State;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cmCTestLog_msg_1,"set_directory_properties",(allocator<char> *)local_1f78);
  cmState::RemoveBuiltinCommand
            ((cmState *)
             uVar2._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
             super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
             super__Head_base<0UL,_cmState_*,_false>._M_head_impl,(string *)&cmCTestLog_msg_1);
  std::__cxx11::string::~string((string *)&cmCTestLog_msg_1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cmCTestLog_msg_1,"set_directory_properties",(allocator<char> *)local_1f78);
  local_1f48 = (code *)0x0;
  pcStack_1f40 = (code *)0x0;
  local_1f58._M_unused._M_object = (void *)0x0;
  local_1f58._8_8_ = 0;
  local_1f58._M_unused._M_object = operator_new(0x10);
  *(cmCTestTestHandler **)((long)local_1f58._M_unused._0_8_ + 8) = this;
  *(undefined ***)local_1f58._M_unused._0_8_ = &PTR__cmCTestCommand_00a0db70;
  pcStack_1f40 = std::
                 _Function_handler<bool_(const_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_&,_cmExecutionStatus_&),_(anonymous_namespace)::cmCTestSetDirectoryPropertiesCommand>
                 ::_M_invoke;
  local_1f48 = std::
               _Function_handler<bool_(const_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_&,_cmExecutionStatus_&),_(anonymous_namespace)::cmCTestSetDirectoryPropertiesCommand>
               ::_M_manager;
  cmState::AddBuiltinCommand
            ((cmState *)
             cm.State._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
             super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
             super__Head_base<0UL,_cmState_*,_false>._M_head_impl,(string *)&cmCTestLog_msg_1,
             (Command *)&local_1f58);
  std::_Function_base::~_Function_base((_Function_base *)&local_1f58);
  std::__cxx11::string::~string((string *)&cmCTestLog_msg_1);
  __s = "CTestTestfile.cmake";
  bVar3 = cmsys::SystemTools::FileExists("CTestTestfile.cmake");
  if (!bVar3) {
    __s = "DartTestfile.txt";
    bVar3 = cmsys::SystemTools::FileExists("DartTestfile.txt");
    bVar7 = true;
    if (!bVar3) goto LAB_001dce9f;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cmCTestLog_msg_1,__s,(allocator<char> *)local_1f78);
  bVar3 = cmMakefile::ReadListFile(&mf,(string *)&cmCTestLog_msg_1);
  std::__cxx11::string::~string((string *)&cmCTestLog_msg_1);
  if (bVar3) {
    bVar3 = cmSystemTools::GetErrorOccurredFlag();
    if (!bVar3) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&cmCTestLog_msg_1,"CTEST_RESOURCE_SPEC_FILE",
                 (allocator<char> *)local_1f78);
      cVar6 = cmMakefile::GetDefinition(&mf,(string *)&cmCTestLog_msg_1);
      std::__cxx11::string::~string((string *)&cmCTestLog_msg_1);
      if (cVar6.Value != (string *)0x0 && (this->ResourceSpecFile)._M_string_length == 0) {
        std::__cxx11::string::_M_assign((string *)&this->ResourceSpecFile);
      }
      if ((this->TestListFile)._M_string_length != 0) {
        ReadTestListFile((optional<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&cmCTestLog_msg_1,this,&this->TestListFile);
        std::
        _Optional_payload_base<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::_M_move_assign((_Optional_payload_base<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&this->TestsToRunByName,
                         (_Optional_payload_base<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&cmCTestLog_msg_1);
        std::
        _Optional_payload_base<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::_M_reset((_Optional_payload_base<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)&cmCTestLog_msg_1);
        if ((this->TestsToRunByName).
            super__Optional_base<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_engaged == false) goto LAB_001dce9d;
      }
      if ((this->ExcludeTestListFile)._M_string_length != 0) {
        ReadTestListFile((optional<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&cmCTestLog_msg_1,this,&this->ExcludeTestListFile);
        std::
        _Optional_payload_base<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::_M_move_assign((_Optional_payload_base<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&this->TestsToExcludeByName,
                         (_Optional_payload_base<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&cmCTestLog_msg_1);
        std::
        _Optional_payload_base<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::_M_reset((_Optional_payload_base<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)&cmCTestLog_msg_1);
        if ((this->TestsToExcludeByName).
            super__Optional_base<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_engaged == false) goto LAB_001dce9d;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg_1);
      poVar4 = std::operator<<((ostream *)&cmCTestLog_msg_1,"Done constructing a list of tests");
      std::endl<char,std::char_traits<char>>(poVar4);
      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar1,5,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                   ,0x755,local_1f78[0],(this->super_cmCTestGenericHandler).Quiet);
      std::__cxx11::string::~string((string *)local_1f78);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg_1);
      bVar7 = true;
      goto LAB_001dce9f;
    }
  }
LAB_001dce9d:
  bVar7 = false;
LAB_001dce9f:
  cmMakefile::~cmMakefile(&mf);
  cmGlobalGenerator::~cmGlobalGenerator(&gg);
  cmake::~cmake(&cm);
  return bVar7;
}

Assistant:

bool cmCTestTestHandler::GetListOfTests()
{
  if (!this->IncludeRegExp.empty()) {
    this->IncludeTestsRegularExpression.compile(this->IncludeRegExp);
  }
  if (!this->ExcludeRegExp.empty()) {
    this->ExcludeTestsRegularExpression.compile(this->ExcludeRegExp);
  }
  cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                     "Constructing a list of tests" << std::endl, this->Quiet);
  cmake cm(cmake::RoleScript, cmState::CTest);
  cm.SetHomeDirectory("");
  cm.SetHomeOutputDirectory("");
  cm.GetCurrentSnapshot().SetDefaultDefinitions();
  cmGlobalGenerator gg(&cm);
  cmMakefile mf(&gg, cm.GetCurrentSnapshot());
  mf.AddDefinition("CTEST_CONFIGURATION_TYPE", this->CTest->GetConfigType());

  // Add handler for ADD_TEST
  cm.GetState()->AddBuiltinCommand("add_test", cmCTestAddTestCommand(this));

  // Add handler for SUBDIRS
  cm.GetState()->AddBuiltinCommand("subdirs", cmCTestSubdirCommand);

  // Add handler for ADD_SUBDIRECTORY
  cm.GetState()->AddBuiltinCommand("add_subdirectory",
                                   cmCTestAddSubdirectoryCommand);

  // Add handler for SET_TESTS_PROPERTIES
  cm.GetState()->AddBuiltinCommand("set_tests_properties",
                                   cmCTestSetTestsPropertiesCommand(this));

  // Add handler for SET_DIRECTORY_PROPERTIES
  cm.GetState()->RemoveBuiltinCommand("set_directory_properties");
  cm.GetState()->AddBuiltinCommand("set_directory_properties",
                                   cmCTestSetDirectoryPropertiesCommand(this));

  const char* testFilename;
  if (cmSystemTools::FileExists("CTestTestfile.cmake")) {
    // does the CTestTestfile.cmake exist ?
    testFilename = "CTestTestfile.cmake";
  } else if (cmSystemTools::FileExists("DartTestfile.txt")) {
    // does the DartTestfile.txt exist ?
    testFilename = "DartTestfile.txt";
  } else {
    return true;
  }

  if (!mf.ReadListFile(testFilename)) {
    return false;
  }
  if (cmSystemTools::GetErrorOccurredFlag()) {
    // SEND_ERROR or FATAL_ERROR in CTestTestfile or TEST_INCLUDE_FILES
    return false;
  }
  cmValue specFile = mf.GetDefinition("CTEST_RESOURCE_SPEC_FILE");
  if (this->ResourceSpecFile.empty() && specFile) {
    this->ResourceSpecFile = *specFile;
  }

  if (!this->TestListFile.empty()) {
    this->TestsToRunByName = this->ReadTestListFile(this->TestListFile);
    if (!this->TestsToRunByName) {
      return false;
    }
  }
  if (!this->ExcludeTestListFile.empty()) {
    this->TestsToExcludeByName =
      this->ReadTestListFile(this->ExcludeTestListFile);
    if (!this->TestsToExcludeByName) {
      return false;
    }
  }

  cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                     "Done constructing a list of tests" << std::endl,
                     this->Quiet);
  return true;
}